

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserException.cpp
# Opt level: O1

string * ninx::parser::exception::ParserException::make_message
                   (string *__return_storage_ptr__,int line,string *origin,string *message)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  stringstream s;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar1 = local_1a0;
  if (line < 1) {
    lVar2 = 0x14;
    pcVar3 = "ParserError at EOF: ";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"ParserError at line: ",0x15);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,line);
    lVar2 = 1;
    pcVar3 = " ";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,lVar2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a0,(message->_M_dataplus)._M_p,message->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"\tfrom origin: ",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a0,(origin->_M_dataplus)._M_p,origin->_M_string_length);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string
ninx::parser::exception::ParserException::make_message(int line, const std::string &origin, const std::string &message) {
    std::stringstream s;

    if (line > 0) {  // Error was found in a specific line
        s << "ParserError at line: " << line << " ";
    }else{   // the error was generated by encountering the end of file when unexpected.
        s << "ParserError at EOF: ";
    }

    s << message << std::endl;
    s << "\tfrom origin: " << origin;
    return s.str();
}